

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O0

void __thiscall
CsSignal::SignalBase::addConnection
          (SignalBase *this,
          unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
          *signalMethod,SlotBase *receiver,
          unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
          *slotMethod,ConnectionKind type,write_handle *senderListHandle)

{
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *this_00;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *this_01;
  undefined1 local_a8 [8];
  write_handle receiverListHandle;
  undefined1 local_58 [8];
  ConnectStruct tempStruct;
  write_handle *senderListHandle_local;
  ConnectionKind type_local;
  unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  *slotMethod_local;
  SlotBase *receiver_local;
  unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  *signalMethod_local;
  SignalBase *this_local;
  
  tempStruct._24_8_ = senderListHandle;
  ConnectStruct::ConnectStruct((ConnectStruct *)local_58);
  std::
  unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ::operator=((unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
               *)local_58,signalMethod);
  tempStruct.signalMethod._M_t.
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
        )(__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
          )receiver;
  std::
  unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ::operator=((unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
               *)&tempStruct.receiver,slotMethod);
  tempStruct.slotMethod._M_t.
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl._0_4_ = type
  ;
  this_00 = libguarded::
            rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
            ::write_handle::operator->((write_handle *)tempStruct._24_8_);
  ConnectStruct::ConnectStruct
            ((ConnectStruct *)&receiverListHandle.m_accessed,(ConnectStruct *)local_58);
  libguarded::
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  ::push_back(this_00,(ConnectStruct *)&receiverListHandle.m_accessed);
  ConnectStruct::~ConnectStruct((ConnectStruct *)&receiverListHandle.m_accessed);
  if (receiver != (SlotBase *)0x0) {
    libguarded::
    rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
    ::lock_write((write_handle *)local_a8,&receiver->m_possibleSenders);
    this_01 = libguarded::
              rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
              ::write_handle::operator->((write_handle *)local_a8);
    libguarded::
    rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
    ::push_back(this_01,this);
    libguarded::
    rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
    ::write_handle::~write_handle((write_handle *)local_a8);
  }
  ConnectStruct::~ConnectStruct((ConnectStruct *)local_58);
  return;
}

Assistant:

void CsSignal::SignalBase::addConnection(std::unique_ptr<const Internal::BentoAbstract> signalMethod, const SlotBase *receiver,
                  std::unique_ptr<const Internal::BentoAbstract> slotMethod, ConnectionKind type,
                  libguarded::SharedList<ConnectStruct>::write_handle &senderListHandle) const
{
   struct ConnectStruct tempStruct;

   tempStruct.signalMethod = std::move(signalMethod);
   tempStruct.receiver     = receiver;
   tempStruct.slotMethod   = std::move(slotMethod);
   tempStruct.type         = type;

   senderListHandle->push_back(std::move(tempStruct));

   // broom - senderListHandle->unlock()

   if (receiver != nullptr)  {
      auto receiverListHandle = receiver->m_possibleSenders.lock_write();
      receiverListHandle->push_back(this);
   }
}